

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_buffer.hpp
# Opt level: O0

Mat * __thiscall CircularBuffer<cv::Mat_*>::pop(CircularBuffer<cv::Mat_*> *this)

{
  Mat *ret;
  CircularBuffer<cv::Mat_*> *this_local;
  
  if (this->count_of_elements == 0) {
    this_local = (CircularBuffer<cv::Mat_*> *)0x0;
  }
  else {
    this_local = (CircularBuffer<cv::Mat_*> *)this->data[this->first_element_index];
    this->data[this->first_element_index] = (Mat *)0x0;
    if (this->first_element_index == this->count_of_slots - 1) {
      this->first_element_index = 0;
    }
    else {
      this->first_element_index = this->first_element_index + 1;
    }
    this->count_of_elements = this->count_of_elements - 1;
  }
  return (Mat *)this_local;
}

Assistant:

T *CircularBuffer<T *>::pop()
{
    //remove first element from buffer and return it to the caller
    if(count_of_elements == 0) {
        return nullptr;
    }

    T *ret = data[first_element_index];
    data[first_element_index] = nullptr;
    if(first_element_index == count_of_slots - 1) {
        first_element_index = 0;
    } else {
        first_element_index++;
    }
    count_of_elements--;
    return ret;
}